

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::setShaderSources
          (InvalidShaderCompilerCase *this,Shaders *shaders,ProgramContext *progCtx)

{
  int iVar1;
  undefined4 extraout_var;
  char *fragShaderSourceCStr;
  char *vertShaderSourceCStr;
  pointer local_28;
  pointer local_20;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_20 = (progCtx->vertShaderSource)._M_dataplus._M_p;
  local_28 = (progCtx->fragShaderSource)._M_dataplus._M_p;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x12b8))(shaders->vertShader,1,&local_20,0);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x12b8))(shaders->fragShader,1,&local_28,0);
  return;
}

Assistant:

void InvalidShaderCompilerCase::setShaderSources (const Shaders& shaders, const ProgramContext& progCtx) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	const char* vertShaderSourceCStr = progCtx.vertShaderSource.c_str();
	const char* fragShaderSourceCStr = progCtx.fragShaderSource.c_str();
	gl.shaderSource(shaders.vertShader, 1, &vertShaderSourceCStr, DE_NULL);
	gl.shaderSource(shaders.fragShader, 1, &fragShaderSourceCStr, DE_NULL);
}